

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sdefl.h
# Opt level: O0

void sdefl_put(uchar **dst,sdefl *s,int code,int bitcnt)

{
  uchar *tar;
  int bitcnt_local;
  int code_local;
  sdefl *s_local;
  uchar **dst_local;
  
  s->bits = code << ((byte)s->bitcnt & 0x1f) | s->bits;
  s->bitcnt = bitcnt + s->bitcnt;
  while (7 < s->bitcnt) {
    **dst = (uchar)s->bits;
    s->bits = s->bits >> 8;
    s->bitcnt = s->bitcnt + -8;
    *dst = *dst + 1;
  }
  return;
}

Assistant:

static void
sdefl_put(unsigned char **dst, struct sdefl *s, int code, int bitcnt) {
  s->bits |= (code << s->bitcnt);
  s->bitcnt += bitcnt;
  while (s->bitcnt >= 8) {
    unsigned char *tar = *dst;
    *tar = (unsigned char)(s->bits & 0xFF);
    s->bits >>= 8;
    s->bitcnt -= 8;
    *dst = *dst + 1;
  }
}